

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O3

bool tinyusdz::detail::SerializeAttribute<tinyusdz::value::normal3f>
               (string *attr_name,
               TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *attr,
               string *value_str,string *err)

{
  ostream *poVar1;
  storage_t<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *pcVar3;
  bool bVar4;
  char *pcVar5;
  normal3f value;
  ostringstream ss_e;
  stringstream value_ss;
  string local_380;
  string local_360;
  normal3f local_340;
  string local_330 [3];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start) || ((attr->_empty & 1U) == 0)) {
    if (attr->_blocked == true) {
      ::std::__cxx11::string::_M_replace
                ((ulong)value_str,0,(char *)value_str->_M_string_length,0x3e73e7);
LAB_002d6b0f:
      bVar4 = true;
      goto LAB_002d6b11;
    }
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(attr->_attrib).contained;
    psVar2 = (storage_t<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)&attr->_fallback;
    if ((attr->_attrib).has_value_ != false) {
      psVar2 = (storage_t<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)args;
    }
    if (*(bool *)((long)psVar2 + 0xc) == true) {
      if (*(bool *)((long)psVar2 + 0xd) == false) {
        local_340.z = *(float *)((long)psVar2 + 8);
        local_340._0_8_ = *(undefined8 *)psVar2;
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
        to_xml_string<tinyusdz::value::normal3f>(local_330,&local_340);
        poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_330[0]._M_dataplus._M_p,local_330[0]._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330[0]._M_dataplus._M_p != &local_330[0].field_2) {
          operator_delete(local_330[0]._M_dataplus._M_p,
                          local_330[0].field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)value_str,(string *)local_330);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330[0]._M_dataplus._M_p != &local_330[0].field_2) {
          operator_delete(local_330[0]._M_dataplus._M_p,
                          local_330[0].field_2._M_allocated_capacity + 1);
        }
        goto LAB_002d6b0f;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                 ,0x51);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"SerializeAttribute",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
      poVar1 = (ostream *)::std::ostream::operator<<(local_330,0x1b3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      pcVar5 = "Failed to get the value at default time of `{}`";
      pcVar3 = "";
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                 ,0x51);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"SerializeAttribute",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
      poVar1 = (ostream *)::std::ostream::operator<<(local_330,0x1b9);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      pcVar5 = "Failed to get the value of `{}`";
      pcVar3 = "";
    }
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,pcVar5,pcVar3);
    fmt::format<std::__cxx11::string>
              ((string *)&local_380,(fmt *)&local_360,(string *)attr_name,args);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_330,local_380._M_dataplus._M_p,local_380._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) goto LAB_002d6a82;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc",
               0x51);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_330,"SerializeAttribute",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
    poVar1 = (ostream *)::std::ostream::operator<<(local_330,0x1a6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_360,"TODO: connection attribute","");
    fmt::format(&local_380,&local_360);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_330,local_380._M_dataplus._M_p,local_380._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
LAB_002d6a82:
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
  }
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_380._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
  ::std::ios_base::~ios_base(local_2c0);
  bVar4 = false;
LAB_002d6b11:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar4;
}

Assistant:

bool SerializeAttribute(const std::string &attr_name,
                        const TypedAttributeWithFallback<Animatable<T>> &attr,
                        std::string &value_str, std::string *err) {
  std::stringstream value_ss;

  if (attr.is_connection()) {
    PUSH_ERROR_AND_RETURN(fmt::format("TODO: connection attribute"));
  } else if (attr.is_blocked()) {
    // do nothing
    value_str = "";
    return true;
  } else {
    const Animatable<T> &animatable_value = attr.get_value();
    if (animatable_value.has_default()) {
      T value;
      if (animatable_value.get_scalar(&value)) {
        value_ss << "\"" << to_xml_string(value) << "\"";
      } else {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Failed to get the value at default time of `{}`", attr_name));
      }
    } else { 
      // no time-varying(timesamples) attribute in MaterialX.
      
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to get the value of `{}`", attr_name));
    }
  }

  value_str = value_ss.str();
  return true;
}